

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

Norm2AllModes * icu_63::Norm2AllModes::getNFCInstance(UErrorCode *errorCode)

{
  if (U_ZERO_ERROR < *errorCode) {
    return (Norm2AllModes *)0x0;
  }
  umtx_initOnce((UInitOnce *)&nfcInitOnce,initNFCSingleton,errorCode);
  return nfcSingleton;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }